

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryInvocationCase::genVertexAttribData
          (GeometryInvocationCase *this)

{
  pointer pVVar1;
  
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexPosData,2);
  pVVar1 = (this->super_GeometryShaderRenderTest).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1->m_data[0] = 0.0;
  pVVar1->m_data[1] = -0.3;
  pVVar1->m_data[2] = 0.0;
  pVVar1->m_data[3] = 1.0;
  pVVar1 = (this->super_GeometryShaderRenderTest).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[1].m_data[0] = 0.2;
  pVVar1[1].m_data[1] = 0.3;
  pVVar1[1].m_data[2] = 0.0;
  pVVar1[1].m_data[3] = 1.0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,2);
  pVVar1 = (this->super_GeometryShaderRenderTest).m_vertexAttrData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1->m_data[0] = 1.0;
  pVVar1->m_data[1] = 1.0;
  pVVar1->m_data[2] = 1.0;
  pVVar1->m_data[3] = 1.0;
  pVVar1 = (this->super_GeometryShaderRenderTest).m_vertexAttrData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[1].m_data[0] = 0.8;
  pVVar1[1].m_data[1] = 0.8;
  pVVar1[1].m_data[2] = 0.8;
  pVVar1[1].m_data[3] = 1.0;
  (this->super_GeometryShaderRenderTest).m_numDrawVertices = 2;
  return;
}

Assistant:

void GeometryInvocationCase::genVertexAttribData (void)
{
	m_vertexPosData.resize(2);
	m_vertexPosData[0] = tcu::Vec4(0.0f,-0.3f, 0.0f, 1.0f);
	m_vertexPosData[1] = tcu::Vec4(0.2f, 0.3f, 0.0f, 1.0f);

	m_vertexAttrData.resize(2);
	m_vertexAttrData[0] = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);
	m_vertexAttrData[1] = tcu::Vec4(0.8f, 0.8f, 0.8f, 1.0f);
	m_numDrawVertices = 2;
}